

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,string *error)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  undefined1 local_68 [16];
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"failed",&local_69);
  XmlWriter::scopedElement((XmlWriter *)local_68,(string *)&this->m_xml,(XmlFormatting)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_68 + 0x10),"message",&local_6a);
  XmlWriter::writeAttribute((XmlWriter *)local_68._0_8_,(string *)(local_68 + 0x10),error);
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_68);
  std::__cxx11::string::~string(local_38);
  XmlWriter::endElement(&this->m_xml,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(std::string const &error) {
        m_xml.scopedElement("failed").
            writeAttribute("message", error);
        m_xml.endElement();
    }